

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

int run_test_tcp_close_reset_client(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  undefined8 *extraout_RDX;
  undefined8 unaff_RBX;
  uv_tcp_t *in_RSI;
  uv_tcp_t *handle;
  uv_tcp_t *puVar5;
  undefined1 auStack_38 [16];
  uv_loop_t *puStack_28;
  undefined1 auStack_20 [16];
  code *pcStack_10;
  
  pcStack_10 = (code *)0x1716ea;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_10 = (code *)0x1716f9;
  start_server(loop,in_RSI);
  client_close = 1;
  shutdown_before_close = 0;
  pcStack_10 = (code *)0x171713;
  puVar3 = loop;
  do_connect(loop,in_RSI);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171798;
    if (shutdown_cb_called != 0) goto LAB_0017179d;
    pcStack_10 = (code *)0x17173c;
    puVar3 = loop;
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_001717a2;
    if (write_cb_called != 4) goto LAB_001717a7;
    if (close_cb_called != 1) goto LAB_001717ac;
    if (shutdown_cb_called != 0) goto LAB_001717b1;
    pcStack_10 = (code *)0x171760;
    unaff_RBX = uv_default_loop();
    pcStack_10 = (code *)0x171774;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_10 = (code *)0x17177e;
    uv_run(unaff_RBX,0);
    pcStack_10 = (code *)0x171783;
    puVar3 = (uv_loop_t *)uv_default_loop();
    pcStack_10 = (code *)0x17178b;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x171798;
    run_test_tcp_close_reset_client_cold_1();
LAB_00171798:
    pcStack_10 = (code *)0x17179d;
    run_test_tcp_close_reset_client_cold_2();
LAB_0017179d:
    pcStack_10 = (code *)0x1717a2;
    run_test_tcp_close_reset_client_cold_3();
LAB_001717a2:
    pcStack_10 = (code *)0x1717a7;
    run_test_tcp_close_reset_client_cold_4();
LAB_001717a7:
    pcStack_10 = (code *)0x1717ac;
    run_test_tcp_close_reset_client_cold_5();
LAB_001717ac:
    pcStack_10 = (code *)0x1717b1;
    run_test_tcp_close_reset_client_cold_6();
LAB_001717b1:
    pcStack_10 = (code *)0x1717b6;
    run_test_tcp_close_reset_client_cold_7();
  }
  pcStack_10 = start_server;
  run_test_tcp_close_reset_client_cold_8();
  puVar5 = (uv_tcp_t *)0x194b6a;
  puStack_28 = (uv_loop_t *)0x1717d7;
  pcStack_10 = (code *)unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_20);
  if (iVar1 == 0) {
    puStack_28 = (uv_loop_t *)0x1717ea;
    puVar5 = (uv_tcp_t *)puVar3;
    iVar1 = uv_tcp_init(puVar3,&tcp_server);
    if (iVar1 != 0) goto LAB_0017182a;
    puVar5 = &tcp_server;
    puStack_28 = (uv_loop_t *)0x1717ff;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_20,0);
    if (iVar1 != 0) goto LAB_0017182f;
    puVar5 = &tcp_server;
    puStack_28 = (uv_loop_t *)0x17181b;
    iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_28 = (uv_loop_t *)0x17182a;
    start_server_cold_1();
LAB_0017182a:
    puStack_28 = (uv_loop_t *)0x17182f;
    start_server_cold_2();
LAB_0017182f:
    puStack_28 = (uv_loop_t *)0x171834;
    start_server_cold_3();
  }
  puStack_28 = (uv_loop_t *)do_connect;
  start_server_cold_4();
  handle = (uv_tcp_t *)0x23a3;
  puStack_28 = puVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_38);
  if (iVar1 == 0) {
    handle = &tcp_client;
    iVar1 = uv_tcp_init(puVar5);
    if (iVar1 != 0) goto LAB_00171898;
    handle = &tcp_client;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_38,connect_cb);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    do_connect_cold_1();
LAB_00171898:
    do_connect_cold_2();
  }
  do_connect_cold_3();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 1;
  shutdown_before_close = 1;
  do_connect(loop,handle);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171956;
    if (shutdown_cb_called != 0) goto LAB_0017195b;
    handle = (uv_tcp_t *)0x0;
    iVar1 = uv_run(loop);
    if (iVar1 != 0) goto LAB_00171960;
    if (write_cb_called != 4) goto LAB_00171965;
    if (close_cb_called != 0) goto LAB_0017196a;
    if (shutdown_cb_called != 1) goto LAB_0017196f;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    handle = (uv_tcp_t *)0x0;
    uv_run(uVar4);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_00171956:
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_0017195b:
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_00171960:
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_00171965:
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_0017196a:
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_0017196f:
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(loop,handle);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171a2d;
    if (shutdown_cb_called != 0) goto LAB_00171a32;
    handle = (uv_tcp_t *)0x0;
    iVar1 = uv_run(loop);
    if (iVar1 != 0) goto LAB_00171a37;
    if (write_cb_called != 4) goto LAB_00171a3c;
    if (close_cb_called != 1) goto LAB_00171a41;
    if (shutdown_cb_called != 0) goto LAB_00171a46;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    handle = (uv_tcp_t *)0x0;
    uv_run(uVar4);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_00171a2d:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_00171a32:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_00171a37:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_00171a3c:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_00171a41:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_00171a46:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 1;
  puVar3 = loop;
  do_connect(loop,handle);
  iVar1 = (int)handle;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171b04;
    if (shutdown_cb_called != 0) goto LAB_00171b09;
    iVar1 = 0;
    puVar3 = loop;
    iVar2 = uv_run(loop);
    if (iVar2 != 0) goto LAB_00171b0e;
    if (write_cb_called != 4) goto LAB_00171b13;
    if (close_cb_called != 0) goto LAB_00171b18;
    if (shutdown_cb_called != 1) goto LAB_00171b1d;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    iVar1 = 0;
    uv_run(uVar4);
    puVar3 = (uv_loop_t *)uv_default_loop();
    iVar2 = uv_loop_close(puVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_00171b04:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_00171b09:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_00171b0e:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_00171b13:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_00171b18:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_00171b1d:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(puVar3,&tcp_accepted);
      if (iVar1 == 0) {
        iVar1 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar1;
      }
      goto LAB_00171b7e;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_00171b7e:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x31d840;
}

Assistant:

TEST_IMPL(tcp_close_reset_client) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 1;
  shutdown_before_close = 0;

  do_connect(loop, &tcp_client);

  ASSERT(write_cb_called == 0);
  ASSERT(close_cb_called == 0);
  ASSERT(shutdown_cb_called == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(write_cb_called == 4);
  ASSERT(close_cb_called == 1);
  ASSERT(shutdown_cb_called == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}